

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_regex_options_order(void)

{
  int iVar1;
  undefined8 uVar2;
  char **ppcVar3;
  char **ppcVar4;
  char *flags;
  char *pattern;
  _Bool r;
  bson_error_t error;
  bson_t b;
  char *local_398;
  char *local_390;
  byte local_381;
  undefined1 local_380 [8];
  undefined1 auStack_378 [504];
  undefined1 local_180 [376];
  
  local_381 = bson_init_from_json(local_180,"{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                                  0xffffffffffffffff,local_380);
  local_381 = local_381 & 1;
  if (local_381 == 0) {
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x48b,"test_bson_json_read_regex_options_order","r",auStack_378);
    fflush(_stderr);
    abort();
  }
  uVar2 = bson_bcone_magic();
  ppcVar3 = bcon_ensure_const_char_ptr_ptr(&local_390);
  ppcVar4 = bcon_ensure_const_char_ptr_ptr(&local_398);
  bcon_extract(local_180,"a",uVar2,10,ppcVar3,ppcVar4,0);
  if (local_398 != "ims") {
    iVar1 = strcmp(local_398,"ims");
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_398,"ims");
      abort();
    }
  }
  bson_destroy(local_180);
  local_381 = bson_init_from_json(local_180,"{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                  0xffffffffffffffff,local_380);
  local_381 = local_381 & 1;
  if (local_381 == 0) {
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x493,"test_bson_json_read_regex_options_order","r",auStack_378);
    fflush(_stderr);
    abort();
  }
  uVar2 = bson_bcone_magic();
  ppcVar3 = bcon_ensure_const_char_ptr_ptr(&local_390);
  ppcVar4 = bcon_ensure_const_char_ptr_ptr(&local_398);
  bcon_extract(local_180,"a",uVar2,10,ppcVar3,ppcVar4,0);
  if (local_398 != "ilms") {
    iVar1 = strcmp(local_398,"ilms");
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_398,"ilms");
      abort();
    }
  }
  bson_destroy(local_180);
  return;
}

Assistant:

static void
test_bson_json_read_regex_options_order (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (flags, "ims");

   bson_destroy (&b);

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (flags, "ilms");

   bson_destroy (&b);
}